

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pubsub.hpp
# Opt level: O1

subscriber_pointer __thiscall
pstore::brokerface::channel<std::condition_variable>::new_subscriber
          (channel<std::condition_variable> *this)

{
  int iVar1;
  subscriber<std::condition_variable> *this_00;
  pthread_mutex_t *in_RSI;
  pointer *__ptr;
  __node_gen_type __node_gen;
  not_null<pstore::brokerface::channel<std::condition_variable>_*> local_30;
  long local_28;
  
  iVar1 = pthread_mutex_lock(in_RSI);
  if (iVar1 == 0) {
    this_00 = (subscriber<std::condition_variable> *)operator_new(0x60);
    local_30.ptr_ = (channel<std::condition_variable> *)in_RSI;
    gsl::not_null<pstore::brokerface::channel<std::condition_variable>_*>::ensure_invariant
              (&local_30);
    subscriber<std::condition_variable>::subscriber(this_00,local_30);
    *(subscriber<std::condition_variable> **)&(this->mut_).super___mutex_base._M_mutex = this_00;
    local_28 = (long)in_RSI + 0x30;
    std::
    _Hashtable<pstore::brokerface::subscriber<std::condition_variable>*,pstore::brokerface::subscriber<std::condition_variable>*,std::allocator<pstore::brokerface::subscriber<std::condition_variable>*>,std::__detail::_Identity,std::equal_to<pstore::brokerface::subscriber<std::condition_variable>*>,std::hash<pstore::brokerface::subscriber<std::condition_variable>*>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
    ::
    _M_insert<pstore::brokerface::subscriber<std::condition_variable>*,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<pstore::brokerface::subscriber<std::condition_variable>*,false>>>>
              ();
    pthread_mutex_unlock(in_RSI);
    return (__uniq_ptr_data<pstore::brokerface::subscriber<std::condition_variable>,_std::default_delete<pstore::brokerface::subscriber<std::condition_variable>_>,_true,_true>
            )(__uniq_ptr_data<pstore::brokerface::subscriber<std::condition_variable>,_std::default_delete<pstore::brokerface::subscriber<std::condition_variable>_>,_true,_true>
              )this;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

auto channel<ConditionVariable>::new_subscriber () -> subscriber_pointer {
            std::lock_guard<std::mutex> const lock{mut_};
            auto resl = subscriber_pointer{new subscriber_type (this)};
            subscribers_.insert (resl.get ());
            return resl;
        }